

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::XFBStrideTest::getShaderBody
          (XFBStrideTest *this,GLuint test_case_index,STAGES stage,string *out_assignments,
          string *out_calculations)

{
  pointer ptVar1;
  char *pcVar2;
  TestError *this_00;
  GLchar *text;
  char *__s;
  
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBStrideTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace
            ((ulong)out_calculations,0,(char *)out_calculations->_M_string_length,0x1b32ab9);
  if (ptVar1[test_case_index].m_stage == stage) {
    __s = "    goku = uni_goku;\n";
    if ((stage - TESS_EVAL < 2) || (stage == VERTEX)) {
LAB_008ada5c:
      pcVar2 = (char *)out_assignments->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)out_assignments,0,pcVar2,(ulong)__s);
      if (stage == FRAGMENT) {
        text = Utils::Type::GetGLSLTypeName(&ptVar1[test_case_index].m_type);
        Utils::replaceAllTokens("TYPE",text,out_assignments);
        return;
      }
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x5fca);
  }
  else {
    if (stage - VERTEX < 5) {
      __s = &DAT_01a43728 + *(int *)(&DAT_01a43728 + (ulong)(stage - VERTEX) * 4);
      goto LAB_008ada5c;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x5fda);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void XFBStrideTest::getShaderBody(GLuint test_case_index, Utils::Shader::STAGES stage, std::string& out_assignments,
								  std::string& out_calculations)
{
	const testCase& test_case = m_test_cases[test_case_index];

	out_calculations = "";

	static const GLchar* vs_tes_gs = "    goku = uni_goku;\n";
	static const GLchar* fs		   = "    fs_out = vec4(1, 0.25, 0.5, 0.75);\n"
							  "    if (TYPE(0) == goku)\n"
							  "    {\n"
							  "         fs_out = vec4(1, 0.75, 0.5, 0.5);\n"
							  "    }\n";

	const GLchar* assignments = "";

	if (test_case.m_stage == stage)
	{
		switch (stage)
		{
		case Utils::Shader::GEOMETRY:
			assignments = vs_tes_gs;
			break;
		case Utils::Shader::TESS_EVAL:
			assignments = vs_tes_gs;
			break;
		case Utils::Shader::VERTEX:
			assignments = vs_tes_gs;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}
	}
	else
	{
		switch (stage)
		{
		case Utils::Shader::FRAGMENT:
			assignments = fs;
			break;
		case Utils::Shader::GEOMETRY:
		case Utils::Shader::TESS_CTRL:
		case Utils::Shader::TESS_EVAL:
		case Utils::Shader::VERTEX:
			break;
		default:
			TCU_FAIL("Invalid enum");
		}
	}

	out_assignments = assignments;

	if (Utils::Shader::FRAGMENT == stage)
	{
		Utils::replaceAllTokens("TYPE", test_case.m_type.GetGLSLTypeName(), out_assignments);
	}
}